

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2pt.hxx
# Opt level: O1

double __thiscall P2Pt::pose_poly<double>::fn_t(pose_poly<double> *this,double t,double *o)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  double dVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar49 [64];
  double dVar50;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  double dVar77;
  double dVar78;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  double dVar87;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  double dVar96;
  double dVar98;
  undefined1 auVar97 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  ulong local_70;
  ulong local_48;
  
  auVar49._8_56_ = in_register_00001208;
  auVar49._0_8_ = t;
  dVar2 = t * t;
  dVar3 = dVar2 * t;
  dVar4 = dVar3 * t;
  dVar5 = dVar4 * t;
  dVar1 = dVar2 + 1.0;
  auVar51._8_8_ = 0;
  auVar51._0_8_ = dVar1;
  auVar85._8_8_ = 0;
  auVar85._0_8_ = dVar1 * dVar1 * dVar1;
  auVar7 = vmulsd_avx512f(auVar85,auVar51);
  auVar88._8_8_ = 0;
  auVar88._0_8_ = this->A0;
  auVar62._8_8_ = 0;
  auVar62._0_8_ = dVar3;
  auVar8 = vsubsd_avx512f(auVar49._0_16_,auVar62);
  auVar79._8_8_ = 0;
  auVar79._0_8_ = dVar4;
  auVar10 = vfmadd231sd_fma(auVar88,auVar79,auVar88);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = this->A2;
  auVar73._8_8_ = 0;
  auVar73._0_8_ = dVar2;
  auVar9 = vfmadd231sd_fma(auVar10,auVar73,auVar9);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = this->A1;
  auVar9 = vfmadd231sd_avx512f(auVar9,auVar8,auVar10);
  auVar52._0_8_ = 1.0 / (dVar1 * dVar1);
  auVar52._8_8_ = 0;
  dVar1 = auVar9._0_8_ * auVar52._0_8_;
  *o = dVar1;
  auVar57._8_8_ = 0;
  auVar57._0_8_ = dVar1;
  auVar75._8_8_ = 0;
  auVar75._0_8_ = this->B0;
  dVar6 = dVar3 - dVar5;
  auVar10 = vmovddup_avx512vl(auVar73);
  dVar1 = dVar5 * t;
  auVar104._8_8_ = 0;
  auVar104._0_8_ = dVar1;
  auVar9 = vfmsub231sd_fma(auVar75,auVar104,auVar75);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = this->B1;
  auVar92._8_8_ = 0;
  auVar92._0_8_ = dVar5 + t;
  auVar9 = vfmsub231sd_fma(auVar9,auVar92,auVar11);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = this->B3;
  auVar9 = vfmadd231sd_fma(auVar9,auVar62,auVar12);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = this->B2;
  auVar89._8_8_ = 0;
  auVar89._0_8_ = dVar2 - dVar4;
  auVar9 = vfmadd231sd_fma(auVar9,auVar89,auVar13);
  auVar11 = vdivsd_avx512f(ZEXT816(0x3ff0000000000000),auVar85);
  auVar12 = vmulsd_avx512f(auVar9,auVar11);
  dVar87 = auVar12._0_8_;
  o[1] = dVar87;
  auVar86._8_8_ = 0;
  auVar86._0_8_ = this->C0;
  auVar76._8_8_ = dVar1;
  auVar76._0_8_ = dVar1;
  auVar9 = vaddsd_avx512f(auVar10,auVar76);
  auVar66._8_8_ = 0;
  auVar66._0_8_ = dVar1 * t;
  auVar10 = vsubsd_avx512f(auVar49._0_16_,auVar66);
  auVar102._8_8_ = dVar6;
  auVar102._0_8_ = dVar6;
  auVar102._16_8_ = dVar6;
  auVar102._24_8_ = dVar6;
  auVar102 = vblendpd_avx(ZEXT1632(CONCAT88(auVar9._0_8_,auVar10._0_8_)),auVar102,4);
  auVar103._8_8_ = dVar4;
  auVar103._0_8_ = dVar4;
  auVar103._16_8_ = dVar4;
  auVar103._24_8_ = dVar4;
  auVar102 = vblendpd_avx(auVar102,auVar103,8);
  dVar43 = auVar102._0_8_;
  dVar50 = auVar102._8_8_;
  dVar77 = auVar102._16_8_;
  dVar78 = auVar102._24_8_;
  dVar96 = dVar77 * this->C3 + dVar78 * this->C4;
  dVar98 = dVar43 * this->C1 + dVar50 * this->C2;
  dVar6 = dVar1 * t * t;
  auVar67._0_8_ = dVar96 + dVar98;
  auVar67._8_8_ = dVar96 + dVar98;
  auVar34._8_8_ = 0;
  auVar34._0_8_ = dVar6;
  auVar9 = vfmadd231sd_fma(auVar67,auVar86,auVar34);
  auVar13 = vdivsd_avx512f(ZEXT816(0x3ff0000000000000),auVar7);
  auVar68._8_8_ = 0;
  auVar68._0_8_ = this->C0 + auVar9._0_8_;
  auVar14 = vmulsd_avx512f(auVar68,auVar13);
  vmovsd_avx512f(auVar14);
  o[2] = o[2];
  auVar69._8_8_ = 0;
  auVar69._0_8_ = this->E0;
  auVar9 = vfmadd231sd_fma(auVar69,auVar79,auVar69);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = this->E2;
  auVar9 = vfmadd231sd_fma(auVar9,auVar73,auVar7);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = this->E1;
  auVar9 = vfmadd231sd_avx512f(auVar9,auVar8,auVar15);
  auVar7 = vmulsd_avx512f(auVar9,auVar52);
  vmovsd_avx512f(auVar7);
  o[3] = o[3];
  auVar97._8_8_ = 0;
  auVar97._0_8_ = this->F0;
  auVar9 = vfmsub231sd_fma(auVar97,auVar104,auVar97);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = this->F1;
  auVar9 = vfmsub231sd_fma(auVar9,auVar92,auVar16);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = this->F3;
  auVar9 = vfmadd231sd_fma(auVar9,auVar62,auVar17);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = this->F2;
  auVar9 = vfmadd231sd_fma(auVar9,auVar89,auVar18);
  auVar15 = vmulsd_avx512f(auVar9,auVar11);
  vmovsd_avx512f(auVar15);
  o[4] = o[4];
  dVar96 = dVar77 * this->G3 + dVar78 * this->G4;
  dVar98 = dVar43 * this->G1 + dVar50 * this->G2;
  auVar99._8_8_ = 0;
  auVar99._0_8_ = this->G0;
  auVar70._0_8_ = dVar96 + dVar98;
  auVar70._8_8_ = dVar96 + dVar98;
  auVar10 = vfmadd231sd_fma(auVar70,auVar99,auVar34);
  auVar71._8_8_ = 0;
  auVar71._0_8_ = this->G0 + auVar10._0_8_;
  auVar16 = vmulsd_avx512f(auVar71,auVar13);
  vmovsd_avx512f(auVar16);
  o[5] = o[5];
  auVar100._8_8_ = 0;
  auVar100._0_8_ = this->H0;
  dVar96 = dVar77 * this->H3 + dVar78 * this->H4;
  dVar98 = dVar43 * this->H1 + dVar50 * this->H2;
  auVar58._0_8_ = dVar96 + dVar98;
  auVar58._8_8_ = dVar96 + dVar98;
  auVar35._8_8_ = 0;
  auVar35._0_8_ = dVar6;
  auVar10 = vfmadd231sd_fma(auVar58,auVar100,auVar35);
  dVar6 = auVar13._0_8_ * (this->H0 + auVar10._0_8_);
  o[6] = dVar6;
  auVar36._8_8_ = 0;
  auVar36._0_8_ = this->J0;
  auVar105._8_8_ = 0;
  auVar105._0_8_ = dVar1;
  auVar10 = vfmsub231sd_fma(auVar36,auVar105,auVar36);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = this->J1;
  auVar93._8_8_ = 0;
  auVar93._0_8_ = dVar5 + t;
  auVar10 = vfmsub231sd_fma(auVar10,auVar93,auVar19);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = this->J3;
  auVar10 = vfmadd231sd_fma(auVar10,auVar62,auVar20);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = this->J2;
  auVar90._8_8_ = 0;
  auVar90._0_8_ = dVar2 - dVar4;
  auVar10 = vfmadd231sd_fma(auVar10,auVar90,auVar21);
  auVar13 = vmulsd_avx512f(auVar10,auVar11);
  vmovsd_avx512f(auVar13);
  o[7] = o[7];
  auVar37._8_8_ = 0;
  auVar37._0_8_ = this->K0;
  auVar10 = vfmsub231sd_fma(auVar37,auVar105,auVar37);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = this->K1;
  auVar10 = vfmsub231sd_fma(auVar10,auVar93,auVar22);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = this->K3;
  auVar63._8_8_ = 0;
  auVar63._0_8_ = dVar3;
  auVar10 = vfmadd231sd_fma(auVar10,auVar63,auVar23);
  auVar24._8_8_ = 0;
  auVar24._0_8_ = this->K2;
  auVar10 = vfmadd231sd_fma(auVar10,auVar90,auVar24);
  auVar17 = vmulsd_avx512f(auVar10,auVar11);
  vmovsd_avx512f(auVar17);
  o[8] = o[8];
  auVar38._8_8_ = 0;
  auVar38._0_8_ = this->L0;
  auVar10 = vfmadd231sd_fma(auVar38,auVar79,auVar38);
  auVar25._8_8_ = 0;
  auVar25._0_8_ = this->L2;
  auVar10 = vfmadd231sd_fma(auVar10,auVar73,auVar25);
  auVar26._8_8_ = 0;
  auVar26._0_8_ = this->L1;
  auVar10 = vfmadd231sd_avx512f(auVar10,auVar8,auVar26);
  dVar1 = auVar10._0_8_ * auVar52._0_8_;
  auVar10 = vmulsd_avx512f(auVar7,auVar7);
  auVar18 = vmulsd_avx512f(auVar15,auVar15);
  dVar2 = dVar6 * dVar6;
  auVar19 = vmulsd_avx512f(auVar13,auVar13);
  auVar20 = vmulsd_avx512f(auVar17,auVar17);
  auVar38 = ZEXT816(0xc000000000000000);
  auVar21 = vmulsd_avx512f(auVar7,auVar38);
  dVar50 = auVar10._0_8_;
  auVar39._8_8_ = 0;
  auVar39._0_8_ = dVar50 + dVar50;
  auVar22 = vmulsd_avx512f(auVar19,auVar39);
  auVar23 = vmulsd_avx512f(auVar16,auVar14);
  auVar24 = vmulsd_avx512f(auVar21,auVar19);
  vmovsd_avx512f(auVar21);
  dVar3 = auVar23._0_8_ * auVar24._0_8_;
  auVar101._8_8_ = 0;
  auVar101._0_8_ = dVar6;
  auVar23 = vmulsd_avx512f(auVar101,auVar16);
  auVar24 = vmulsd_avx512f(auVar15,auVar38);
  auVar25 = vmulsd_avx512f(auVar24,auVar7);
  auVar26 = vmulsd_avx512f(auVar15,ZEXT816(0x4008000000000000));
  auVar8 = vmulsd_avx512f(auVar26,auVar7);
  auVar27 = vmulsd_avx512f(auVar17,auVar12);
  auVar28 = vmulsd_avx512f(auVar15,auVar12);
  auVar29 = vfnmsub213sd_avx512f(auVar9,auVar11,ZEXT816(0) << 0x40);
  auVar9 = vmulsd_avx512f(auVar13,auVar16);
  auVar11 = vmulsd_avx512f(auVar14,auVar26);
  auVar30 = vmulsd_avx512f(auVar9,auVar11);
  auVar11 = vmulsd_avx512f(auVar24,auVar20);
  auVar9 = vmulsd_avx512f(auVar9,auVar11);
  auVar11 = vmulsd_avx512f(auVar101,auVar12);
  auVar31 = vmulsd_avx512f(auVar11,auVar8);
  auVar15 = vfnmsub213sd_avx512f(auVar15,auVar15,ZEXT816(0) << 0x40);
  auVar32 = vmulsd_avx512f(auVar15,auVar13);
  auVar32 = vmulsd_avx512f(auVar11,auVar32);
  auVar15 = vmulsd_avx512f(auVar27,auVar15);
  auVar11 = vmulsd_avx512f(auVar7,auVar13);
  auVar11 = vmulsd_avx512f(auVar11,auVar17);
  auVar33 = vmulsd_avx512f(auVar17,auVar25);
  auVar33 = vmulsd_avx512f(auVar33,auVar101);
  auVar40._8_8_ = 0;
  auVar40._0_8_ = dVar2 * auVar22._0_8_;
  auVar22 = vfmadd213sd_avx512f(auVar33,auVar19,auVar40);
  auVar33 = vmulsd_avx512f(auVar19,auVar18);
  auVar22 = vfmadd231sd_avx512f(auVar22,auVar33,auVar20);
  auVar53._8_8_ = 0;
  auVar53._0_8_ = auVar23._0_8_ * 8.0 * auVar11._0_8_;
  auVar80._8_8_ = 0;
  auVar80._0_8_ = dVar1;
  auVar11 = vfmadd231sd_avx512f(auVar22,auVar80,auVar53);
  auVar22 = vmulsd_avx512f(auVar24,auVar17);
  auVar81._8_8_ = 0;
  auVar81._0_8_ = dVar1;
  auVar34 = vmulsd_avx512f(auVar80,auVar81);
  auVar41._8_8_ = 0;
  auVar41._0_8_ = auVar23._0_8_ * auVar22._0_8_;
  auVar11 = vfmadd231sd_avx512f(auVar11,auVar34,auVar41);
  auVar22 = vmulsd_avx512f(auVar81,auVar13);
  auVar35 = vmulsd_avx512f(auVar22,auVar25);
  auVar94._8_8_ = 0;
  auVar94._0_8_ = dVar2;
  auVar11 = vfmadd231sd_avx512f(auVar11,auVar94,auVar35);
  auVar42._8_8_ = 0;
  auVar42._0_8_ = dVar2 * auVar18._0_8_;
  auVar11 = vfmadd231sd_avx512f(auVar11,auVar34,auVar42);
  auVar35 = vmulsd_avx512f(auVar16,auVar16);
  auVar36 = vmulsd_avx512f(auVar34,auVar35);
  dVar43 = auVar36._0_8_;
  auVar44._8_8_ = 0;
  auVar44._0_8_ = dVar43 + dVar43;
  auVar11 = vfmadd231sd_avx512f(auVar11,auVar20,auVar44);
  auVar36 = vfmadd231sd_avx512f(auVar11,auVar81,auVar9);
  auVar9 = vmulsd_avx512f(auVar10,auVar38);
  dVar4 = dVar87 * auVar9._0_8_;
  auVar37 = vmulsd_avx512f(auVar94,auVar101);
  auVar45._8_8_ = 0;
  auVar45._0_8_ = dVar4;
  auVar9 = vmulsd_avx512f(auVar45,auVar37);
  auVar74._8_8_ = 0;
  auVar74._0_8_ = auVar27._0_8_ * auVar8._0_8_;
  auVar9 = vfmadd213sd_fma(auVar74,auVar94,auVar9);
  auVar27 = vmulsd_avx512f(auVar20,auVar17);
  auVar10 = vmulsd_avx512f(auVar16,auVar28);
  auVar11 = vfmadd231sd_fma(auVar9,auVar27,auVar10);
  vmovsd_avx512f(auVar57);
  auVar9 = vmulsd_avx512f(auVar57,auVar21);
  auVar9 = vmulsd_avx512f(auVar16,auVar9);
  auVar21 = vmulsd_avx512f(auVar9,auVar94);
  auVar9 = vmulsd_avx512f(auVar30,auVar34);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = dVar3;
  auVar10 = vaddsd_avx512f(auVar21,auVar8);
  auVar9 = vfmadd213sd_fma(auVar10,auVar81,auVar9);
  auVar23 = vmulsd_avx512f(auVar23,auVar12);
  auVar12 = vmulsd_avx512f(auVar12,auVar38);
  dVar5 = dVar87 * dVar87;
  auVar54._8_8_ = 0;
  auVar54._0_8_ = dVar5;
  auVar8 = vmulsd_avx512f(auVar7,auVar54);
  dVar6 = auVar8._0_8_ * auVar29._0_8_;
  auVar46._8_8_ = 0;
  auVar46._0_8_ = dVar6;
  auVar10 = vmulsd_avx512f(auVar46,auVar19);
  auVar30 = vmulsd_avx512f(auVar22,auVar54);
  auVar10 = vfmadd213sd_fma(auVar30,auVar18,auVar10);
  dVar96 = auVar29._0_8_ * dVar5;
  auVar29 = vmulsd_avx512f(auVar34,auVar16);
  auVar47._8_8_ = 0;
  auVar47._0_8_ = dVar96;
  auVar10 = vfmadd231sd_fma(auVar10,auVar47,auVar29);
  auVar59._8_8_ = 0;
  auVar59._0_8_ = dVar87 * auVar9._0_8_;
  auVar9 = vfmadd213sd_fma(auVar10,auVar101,auVar59);
  auVar38 = vmulsd_avx512f(auVar57,auVar57);
  auVar39 = vmulsd_avx512f(auVar101,auVar38);
  auVar40 = vmulsd_avx512f(auVar101,auVar14);
  auVar10 = vmulsd_avx512f(auVar24,auVar27);
  auVar29 = vmulsd_avx512f(auVar39,auVar10);
  auVar10 = vmulsd_avx512f(auVar13,auVar24);
  auVar24 = vmulsd_avx512f(auVar14,auVar14);
  auVar10 = vmulsd_avx512f(auVar10,auVar24);
  auVar10 = vfmadd231sd_fma(auVar10,auVar40,auVar28);
  auVar82._8_8_ = 0;
  auVar82._0_8_ = dVar1;
  auVar30 = vmulsd_avx512f(auVar34,auVar82);
  auVar10 = vfmadd213sd_fma(auVar10,auVar30,auVar29);
  auVar12 = vmulsd_avx512f(auVar12,auVar35);
  auVar28 = vmulsd_avx512f(auVar28,auVar7);
  auVar41 = vmulsd_avx512f(auVar19,auVar13);
  auVar29 = vmulsd_avx512f(auVar28,auVar41);
  auVar29 = vfmadd231sd_avx512f(auVar29,auVar30,auVar12);
  auVar28 = vmulsd_avx512f(auVar37,auVar28);
  auVar42 = vfmadd231sd_avx512f(auVar28,auVar27,auVar12);
  dVar98 = dVar1 * auVar15._0_8_;
  auVar72._8_8_ = 0;
  auVar72._0_8_ = dVar2 * dVar98;
  auVar15 = vfmadd213sd_avx512f(auVar36,auVar14,auVar72);
  auVar64._8_8_ = 0;
  auVar64._0_8_ = auVar25._0_8_;
  auVar12 = vmulsd_avx512f(auVar64,auVar37);
  auVar12 = vfmadd231sd_fma(auVar12,auVar27,auVar35);
  auVar25 = vfmadd231sd_avx512f(auVar9,auVar14,auVar29);
  auVar7 = vaddsd_avx512f(auVar7,auVar7);
  auVar9 = vmulsd_avx512f(auVar7,auVar16);
  auVar27._8_8_ = 0;
  auVar27._0_8_ = dVar43;
  auVar9 = vfmadd213sd_avx512f(auVar9,auVar19,auVar27);
  auVar28._8_8_ = 0;
  auVar28._0_8_ = auVar33._0_8_;
  auVar9 = vaddsd_avx512f(auVar9,auVar28);
  auVar8 = vmulsd_avx512f(auVar8,auVar16);
  auVar95._8_8_ = 0;
  auVar95._0_8_ = dVar2;
  auVar27 = vmulsd_avx512f(auVar95,auVar8);
  auVar55._8_8_ = 0;
  auVar55._0_8_ = dVar5;
  auVar83._8_8_ = 0;
  auVar83._0_8_ = auVar20._0_8_ * auVar35._0_8_;
  auVar27 = vfmadd231sd_avx512f(auVar27,auVar55,auVar83);
  auVar9 = vfmadd231sd_avx512f(auVar27,auVar24,auVar9);
  auVar29._8_8_ = 0;
  auVar29._0_8_ = local_70;
  auVar27 = vmulsd_avx512f(auVar13,auVar29);
  auVar27 = vmulsd_avx512f(auVar23,auVar27);
  auVar60._8_8_ = 0;
  auVar60._0_8_ = auVar32._0_8_;
  auVar21 = vaddsd_avx512f(auVar21,auVar60);
  auVar21 = vaddsd_avx512f(auVar27,auVar21);
  auVar21 = vfmadd231sd_avx512f(auVar9,auVar14,auVar21);
  auVar48._8_8_ = 0;
  auVar48._0_8_ = dVar98;
  auVar108._8_8_ = 0;
  auVar108._0_8_ = auVar31._0_8_;
  auVar28 = vfmadd213sd_avx512f(auVar108,auVar82,auVar48);
  auVar106._8_8_ = 0;
  auVar106._0_8_ = dVar50;
  auVar9 = vmulsd_avx512f(auVar106,auVar55);
  auVar56._8_8_ = 0;
  auVar56._0_8_ = dVar2 * auVar9._0_8_;
  auVar9 = vfmadd231sd_fma(auVar56,auVar20,auVar8);
  auVar8 = vfmadd231sd_avx512f(auVar9,auVar14,auVar28);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = auVar26._0_8_;
  auVar9 = vmulsd_avx512f(auVar23,auVar14);
  auVar84._8_8_ = 0;
  auVar84._0_8_ = auVar32._0_8_ + dVar3 + auVar27._0_8_;
  auVar9 = vfmadd231sd_fma(auVar84,auVar82,auVar9);
  auVar9 = vfmadd231sd_avx512f(auVar15,auVar20,auVar9);
  auVar30._8_8_ = 0;
  auVar30._0_8_ = auVar11._0_8_;
  auVar15 = vfmadd231sd_avx512f(auVar9,auVar13,auVar30);
  auVar9 = vmulsd_avx512f(auVar106,auVar13);
  auVar9 = vfmadd231sd_fma(auVar9,auVar82,auVar64);
  auVar91._8_8_ = 0;
  auVar91._0_8_ = auVar40._0_8_ * dVar4;
  auVar9 = vfmadd213sd_avx512f(auVar9,auVar24,auVar91);
  auVar11 = vfmadd231sd_fma(auVar25,auVar38,auVar12);
  auVar31._8_8_ = 0;
  auVar31._0_8_ = dVar96;
  auVar65._8_8_ = 0;
  auVar65._0_8_ = dVar2 * auVar38._0_8_ * auVar7._0_8_;
  auVar12 = vfmadd231sd_avx512f(auVar65,auVar22,auVar31);
  auVar10 = vfmadd231sd_fma(auVar10,auVar20,auVar12);
  auVar32._8_8_ = 0;
  auVar32._0_8_ = dVar6;
  auVar61._8_8_ = 0;
  auVar61._0_8_ = auVar20._0_8_ * auVar38._0_8_ * auVar18._0_8_;
  auVar12 = vfmadd231sd_avx512f(auVar61,auVar22,auVar32);
  auVar107._8_8_ = 0;
  auVar107._0_8_ = dVar50;
  auVar13 = vmulsd_avx512f(auVar39,auVar107);
  auVar13 = vmulsd_avx512f(auVar13,auVar37);
  auVar9 = vfmadd213sd_fma(auVar9,auVar41,auVar13);
  auVar9 = vfmadd231sd_fma(auVar9,auVar95,auVar12);
  auVar9 = vfmadd231sd_avx512f(auVar9,auVar19,auVar8);
  auVar9 = vfmadd231sd_avx512f(auVar9,auVar16,auVar10);
  auVar9 = vfmadd231sd_avx512f(auVar9,auVar34,auVar21);
  auVar9 = vfmadd231sd_avx512f(auVar9,auVar17,auVar11);
  auVar10 = vfmadd231sd_avx512f(auVar15,auVar82,auVar42);
  auVar33._8_8_ = 0;
  auVar33._0_8_ = local_48;
  auVar9 = vfmadd231sd_avx512f(auVar9,auVar10,auVar33);
  o[9] = dVar1;
  return auVar9._0_8_;
}

Assistant:

inline T fn_t(const T t, T o[10]) {  //o: output
    T &A = o[0]; T &B = o[1]; T &C = o[2]; T &E = o[3]; T &F = o[4]; 
    T &G = o[5]; T &H = o[6]; T &J = o[7]; T &K = o[8]; T &L = o[9];

    //%function of t part :
    const T t2 = t*t, t3 = t2*t, t4 = t3*t, t5 = t4*t, t6 = t5*t, t7 = t6*t, t8 = t7*t;
    const T t2p12 = (t2 + 1.) * (t2 + 1.), t2p13 = t2p12 * (t2 + 1.), t2p14 = t2p13 * (t2 + 1.);

    A = (A0+A1*t+A2*t2-A1*t3+A0*t4)/t2p12;
    B = (B0+B1*t+B2*t2+B3*t3-B2*t4+B1*t5-B0*t6)/t2p13;
    C = (C0+C1*t+C2*t2+C3*t3+C4*t4-C3*t5+C2*t6-C1*t7+C0*t8)/t2p14;
    E = (E0+E1*t+E2*t2-E1*t3+E0*t4)/t2p12;
    F = (F0+F1*t+F2*t2+F3*t3-F2*t4+F1*t5-F0*t6)/t2p13;
    G = (G0+G1*t+G2*t2+G3*t3+G4*t4-G3*t5+G2*t6-G1*t7+G0*t8)/t2p14;
    H = (H0+H1*t+H2*t2+H3*t3+H4*t4-H3*t5+H2*t6-H1*t7+H0*t8)/t2p14;
    J = (J0+J1*t+J2*t2+J3*t3-J2*t4+J1*t5-J0*t6)/t2p13;
    K = (K0+K1*t+K2*t2+K3*t3-K2*t4+K1*t5-K0*t6)/t2p13;
    L = (L0+L1*t+L2*t2-L1*t3+L0*t4)/t2p12;

    const T A2=A*A, B2=B*B, C2=C*C, E2=E*E, F2=F*F, G2=G*G, H2=H*H, 
            H3=H2*H, H4=H3*H, J2=J*J, J3=J2*J, K2=K*K, K3=K2*K, L2=L*L, L3=L2*L;
    
    return E2*B2*H2*J2 +G2*C2*L*L*L*L +G2*A2*K3*K +E2*A2*H4 +E2*C2*J3*J
    +-2.*E*A*H2*G*C*L2 +2.*E2*A*H2*C*J2 +-2.*E2*C*J3*B*H +2.*E*C2*J2*G*L2
    +2.*E*A2*H2*G*K2 +-2.*E2*A*H3*B*J +-2.*E*A*H2*G*B*K*L +-2.*E*C*J2*G*B*K*L
    +-2.*E*C*J2*G*A*K2 +-2.*E*B*H*J*G*C*L2 +-2.*E*B*H*J*G*A*K2 +G2*B2*K2*L2
    +-2.*G2*B*K*L3*C +-2.*G2*B*K3*L*A +2.*G2*C*L2*A*K2 +-2.*F*E*A2*H3*K
    +-2.*F*E*A*H*K*C*J2 +3.*F*E*A*H2*K*B*J +3.*F*A*H*K2*G*B*L
    +-2.*F*A*H*K*G*C*L2 +-2.*F*A2*H*K3*G +F*E*B*H3*L*A +3.*F*E*B*H*L*C*J2
    +-1.*F*E*B2*H2*L*J +-1.*F*B2*H*L2*G*K +F*B*H*L3*G*C +F*E*B*K*J3*C
    +-1.*F*E*B2*K*J2*H +-1.*F*B2*K2*J*G*L +3.*F*B*K*J*G*C*L2 +F*B*K3*J*G*A
    +-2.*F*E*C*J*L*A*H2 +-2.*F*E*C2*J3*L +-2.*F*C2*J*L3*G +-2.*F*C*J*L*G*A*K2
    +F2*A2*K2*H2 +F2*A*K2*C*J2 +-1.*F2*A*K2*B*H*J +-1.*F2*B*K*L*A*H2
    +-1.*F2*B*K*L*C*J2 +F2*B2*K*L*H*J +F2*C*L2*A*H2 +F2*C2*L2*J2
    +-1.*F2*C*L2*B*H*J +G*E*B2*H2*L2 +G*E*B2*K2*J2 +8.*G*E*A*H*K*C*J*L;
  }